

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O1

void __thiscall
TStokesAnalytic::Force(TStokesAnalytic *this,TPZVec<double> *x,TPZVec<double> *force)

{
  double *pdVar1;
  int i;
  long lVar2;
  int f_2;
  long lVar3;
  int f;
  long lVar4;
  int e;
  TPZFMatrix<double> grad;
  TPZManVector<double,_3> xst;
  TPZManVector<double,_3> beta;
  TPZManVector<double,_3> locforce;
  TPZManVector<double,_3> gradU_beta;
  TPZManVector<double,_3> gradUt_beta;
  TPZFMatrix<double> local_1e8;
  double local_158;
  double local_150;
  TPZManVector<double,_3> local_148;
  TPZManVector<double,_3> local_110;
  TPZManVector<double,_3> local_d8;
  TPZManVector<double,_3> local_a0;
  TPZManVector<double,_3> local_68;
  
  local_1e8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)0x0;
  TPZManVector<double,_3>::TPZManVector(&local_d8,3,(double *)&local_1e8);
  local_1e8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)0x0;
  TPZManVector<double,_3>::TPZManVector(&local_110,3,(double *)&local_1e8);
  local_1e8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)0x0;
  TPZManVector<double,_3>::TPZManVector(&local_a0,3,(double *)&local_1e8);
  local_1e8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)0x0;
  TPZManVector<double,_3>::TPZManVector(&local_68,3,(double *)&local_1e8);
  TPZManVector<double,_3>::TPZManVector(&local_148,3);
  local_1e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_1e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 3;
  local_1e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_1e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_1e8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183c898;
  local_1e8.fElem = (double *)0x0;
  local_1e8.fGiven = (double *)0x0;
  local_1e8.fSize = 0;
  TPZVec<int>::TPZVec(&local_1e8.fPivot.super_TPZVec<int>,0);
  local_1e8.fPivot.super_TPZVec<int>.fStore = local_1e8.fPivot.fExtAlloc;
  local_1e8.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_1e8.fPivot.super_TPZVec<int>.fNElements = 0;
  local_1e8.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_1e8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_1e8.fWork.fStore = (double *)0x0;
  local_1e8.fWork.fNElements = 0;
  local_1e8.fWork.fNAlloc = 0;
  local_1e8.fElem = (double *)operator_new__(0x48);
  local_1e8.fElem[6] = 0.0;
  local_1e8.fElem[7] = 0.0;
  local_1e8.fElem[4] = 0.0;
  local_1e8.fElem[5] = 0.0;
  local_1e8.fElem[2] = 0.0;
  local_1e8.fElem[3] = 0.0;
  *local_1e8.fElem = 0.0;
  local_1e8.fElem[1] = 0.0;
  local_1e8.fElem[8] = 0.0;
  pdVar1 = x->fStore;
  lVar2 = 0;
  do {
    local_148.super_TPZVec<double>.fStore[lVar2] = pdVar1[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  DivSigma<double>(this,x,&local_d8.super_TPZVec<double>);
  switch(this->fProblemType) {
  case EStokes:
    pdVar1 = force->fStore;
    *pdVar1 = -*local_d8.super_TPZVec<double>.fStore;
    pdVar1[1] = -local_d8.super_TPZVec<double>.fStore[1];
    pdVar1[2] = -local_d8.super_TPZVec<double>.fStore[2];
    break;
  case ENavierStokes:
  case EOseen:
    graduxy<double>(this,&local_148.super_TPZVec<double>,&local_1e8);
    uxy<double>(this,&local_148.super_TPZVec<double>,&local_110.super_TPZVec<double>);
    lVar2 = 0;
    do {
      lVar4 = 0;
      do {
        if ((local_1e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar2) ||
           (local_1e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar4)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        local_a0.super_TPZVec<double>.fStore[lVar2] =
             local_1e8.fElem
             [local_1e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar4 + lVar2] *
             local_110.super_TPZVec<double>.fStore[lVar4] +
             local_a0.super_TPZVec<double>.fStore[lVar2];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
    pdVar1 = force->fStore;
    *pdVar1 = *local_a0.super_TPZVec<double>.fStore - *local_d8.super_TPZVec<double>.fStore;
    pdVar1[1] = local_a0.super_TPZVec<double>.fStore[1] - local_d8.super_TPZVec<double>.fStore[1];
    pdVar1[2] = local_a0.super_TPZVec<double>.fStore[2] - local_d8.super_TPZVec<double>.fStore[2];
    break;
  case ENavierStokesCDG:
  case EOseenCDG:
    graduxy<double>(this,&local_148.super_TPZVec<double>,&local_1e8);
    uxy<double>(this,&local_148.super_TPZVec<double>,&local_110.super_TPZVec<double>);
    lVar2 = 0;
    do {
      lVar4 = 0;
      do {
        if ((local_1e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar2) ||
           (local_1e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar4)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        local_a0.super_TPZVec<double>.fStore[lVar2] =
             local_1e8.fElem
             [local_1e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar4 + lVar2] *
             local_110.super_TPZVec<double>.fStore[lVar4] +
             local_a0.super_TPZVec<double>.fStore[lVar2];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
    lVar4 = 0;
    lVar2 = 0;
    do {
      lVar3 = 0;
      do {
        if ((local_1e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar3) ||
           (local_1e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar2)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        local_68.super_TPZVec<double>.fStore[lVar2] =
             *(double *)
              ((long)local_1e8.fElem +
              lVar3 * 8 + local_1e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar4) *
             local_110.super_TPZVec<double>.fStore[lVar3] +
             local_68.super_TPZVec<double>.fStore[lVar2];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
      lVar2 = lVar2 + 1;
      lVar4 = lVar4 + 8;
    } while (lVar2 != 3);
    pdVar1 = force->fStore;
    *pdVar1 = (*local_a0.super_TPZVec<double>.fStore - *local_d8.super_TPZVec<double>.fStore) -
              *local_68.super_TPZVec<double>.fStore;
    pdVar1[1] = (local_a0.super_TPZVec<double>.fStore[1] - local_d8.super_TPZVec<double>.fStore[1])
                - local_68.super_TPZVec<double>.fStore[1];
    pdVar1[2] = (local_a0.super_TPZVec<double>.fStore[2] - local_d8.super_TPZVec<double>.fStore[2])
                - local_68.super_TPZVec<double>.fStore[2];
    break;
  case EBrinkman:
    uxy<double>(this,&local_148.super_TPZVec<double>,&local_110.super_TPZVec<double>);
    pdVar1 = force->fStore;
    *pdVar1 = this->fcBrinkman * *local_110.super_TPZVec<double>.fStore -
              *local_d8.super_TPZVec<double>.fStore;
    pdVar1[1] = this->fcBrinkman * local_110.super_TPZVec<double>.fStore[1] -
                local_d8.super_TPZVec<double>.fStore[1];
    pdVar1[2] = this->fcBrinkman * local_110.super_TPZVec<double>.fStore[2] -
                local_d8.super_TPZVec<double>.fStore[2];
    graduxy<double>(this,&local_148.super_TPZVec<double>,&local_1e8);
    if ((local_1e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
       (local_1e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_150 = *local_1e8.fElem;
    if ((local_1e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 2) ||
       (local_1e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_158 = local_1e8.fElem[local_1e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow + 1];
    if ((local_1e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 3) ||
       (local_1e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 3)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    force->fStore[3] =
         local_150 + local_158 +
         local_1e8.fElem[local_1e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * 2 + 2];
    break;
  default:
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZAnalyticSolution.cpp"
               ,0xa57);
  }
  TPZFMatrix<double>::~TPZFMatrix(&local_1e8);
  TPZManVector<double,_3>::~TPZManVector(&local_148);
  TPZManVector<double,_3>::~TPZManVector(&local_68);
  TPZManVector<double,_3>::~TPZManVector(&local_a0);
  TPZManVector<double,_3>::~TPZManVector(&local_110);
  TPZManVector<double,_3>::~TPZManVector(&local_d8);
  return;
}

Assistant:

void TStokesAnalytic::Force(const TPZVec<REAL> &x, TPZVec<STATE> &force) const
{

    TPZManVector<STATE,3> locforce(3,0.),beta(3,0.),gradU_beta(3,0.),gradUt_beta(3,0.),xst(3);
    TPZFMatrix<STATE> grad(3,3,0.);
    for(int i=0; i<3; i++) xst[i] = x[i];
    DivSigma(x, locforce);

    switch(fProblemType)
    {
        case EStokes:
            force[0] = -locforce[0];
            force[1] = -locforce[1];
            force[2] = -locforce[2];
            break;

        case EBrinkman:
    	    uxy(xst,beta);
            force[0] = -locforce[0]+fcBrinkman*beta[0];
            force[1] = -locforce[1]+fcBrinkman*beta[1];
            force[2] = -locforce[2]+fcBrinkman*beta[2];
	    graduxy(xst,grad);
            force[3] = grad(0,0)+grad(1,1)+grad(2,2); //Pressure block term
            break;
            
        case ENavierStokes:
        case EOseen:

            graduxy(xst,grad);
            uxy(xst,beta);
            
            for (int e=0; e<3; e++) {
                for (int f=0; f<3; f++) {
                    gradU_beta[e] += grad(e,f)*beta[f];
                }
            }
            
            force[0] = -locforce[0]+gradU_beta[0];
            force[1] = -locforce[1]+gradU_beta[1];
            force[2] = -locforce[2]+gradU_beta[2];
            break;

        case ENavierStokesCDG:
        case EOseenCDG:

            graduxy(xst,grad);
            uxy(xst,beta);

            for (int e=0; e<3; e++) {
                for (int f=0; f<3; f++) {
                    gradU_beta[e] += grad(e,f)*beta[f];
                }
            }

            for (int e=0; e<3; e++) {
                for (int f=0; f<3; f++) {
                    gradUt_beta[e] += grad(f,e)*beta[f];
                }
            }

            force[0] = -locforce[0]+gradU_beta[0]-gradUt_beta[0];
            force[1] = -locforce[1]+gradU_beta[1]-gradUt_beta[1];
            force[2] = -locforce[2]+gradU_beta[2]-gradUt_beta[2];
            break;
            
        default:
            DebugStop();
    }



}